

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# divsufsortxx.h
# Opt level: O3

void divsufsortxx::helper::
     fixdown<divsufsortxx::substring::substring_wrapper<char*,bitmap::BitmapArray<long>::iterator>,bitmap::BitmapArray<long>::iterator,long>
               (substring_wrapper<char_*,_bitmap::BitmapArray<long>::iterator> Td,iterator SA,long i
               ,long size)

{
  char cVar1;
  char cVar2;
  char cVar3;
  int iVar4;
  int iVar5;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  long lVar6;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  undefined4 extraout_var_04;
  undefined4 extraout_var_05;
  char cVar7;
  long lVar8;
  pos_type pVar9;
  BitmapArray<long> *pBVar10;
  long lVar11;
  long lVar12;
  
  pVar9 = SA.pos_;
  pBVar10 = SA.array_;
  lVar12 = i + pVar9;
  iVar4 = (*(pBVar10->super_Bitmap)._vptr_Bitmap[5])(pBVar10,lVar12);
  iVar5 = (*((Td.m_PA.array_)->super_Bitmap)._vptr_Bitmap[5])
                    (Td.m_PA.array_,CONCAT44(extraout_var,iVar4) + Td.m_PA.pos_);
  lVar8 = i * 2 + 1;
  if (lVar8 < size) {
    cVar1 = Td.m_Td[CONCAT44(extraout_var_00,iVar5)];
    lVar6 = i * 2;
    do {
      iVar5 = (*(pBVar10->super_Bitmap)._vptr_Bitmap[5])(pBVar10,lVar8 + pVar9);
      iVar5 = (*((Td.m_PA.array_)->super_Bitmap)._vptr_Bitmap[5])
                        (Td.m_PA.array_,CONCAT44(extraout_var_01,iVar5) + Td.m_PA.pos_);
      cVar2 = Td.m_Td[CONCAT44(extraout_var_02,iVar5)];
      iVar5 = (*(pBVar10->super_Bitmap)._vptr_Bitmap[5])(pBVar10,lVar6 + pVar9 + 2);
      iVar5 = (*((Td.m_PA.array_)->super_Bitmap)._vptr_Bitmap[5])
                        (Td.m_PA.array_,CONCAT44(extraout_var_03,iVar5) + Td.m_PA.pos_);
      cVar3 = Td.m_Td[CONCAT44(extraout_var_04,iVar5)];
      cVar7 = cVar2;
      if (cVar2 <= cVar3) {
        cVar7 = cVar3;
      }
      if (cVar7 <= cVar1) {
        lVar12 = i + pVar9;
        break;
      }
      lVar11 = lVar8;
      if (cVar2 < cVar3) {
        lVar11 = lVar6 + 2;
      }
      lVar12 = lVar11 + pVar9;
      iVar5 = (*(pBVar10->super_Bitmap)._vptr_Bitmap[5])(pBVar10,lVar12);
      (*(pBVar10->super_Bitmap)._vptr_Bitmap[4])(pBVar10,i + pVar9,CONCAT44(extraout_var_05,iVar5));
      lVar6 = lVar11 * 2;
      lVar8 = lVar11 * 2 + 1;
      i = lVar11;
    } while (lVar8 < size);
  }
  (*(pBVar10->super_Bitmap)._vptr_Bitmap[4])(pBVar10,lVar12,CONCAT44(extraout_var,iVar4));
  return;
}

Assistant:

void fixdown(const StringIterator_type Td, SAIterator_type SA, pos_type i,
             pos_type size) {
  typedef typename std::iterator_traits<StringIterator_type>::value_type value_type;
  pos_type j, k, t;
  value_type c, d, e;

  for (t = SA[i], c = Td[t]; (j = 2 * i + 1) < size; SA[i] = SA[k], i = k) {
    d = Td[SA[k = j++]];
    if (d < (e = Td[SA[j]])) {
      k = j;
      d = e;
    }
    if (d <= c) {
      break;
    }
  }
  SA[i] = t;
}